

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_chain_methods<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>
               (void)

{
  key_type *__k;
  undefined8 ****ppppuVar1;
  undefined8 ****ppppuVar2;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
  *this;
  pair<std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
  pVar3;
  List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
  col;
  Column_settings settings;
  shared_count sStack_258;
  char *local_250;
  char *local_248;
  undefined **local_240;
  undefined1 local_238;
  undefined8 *local_230;
  char **local_228;
  undefined4 local_220;
  long *local_218;
  undefined8 local_210;
  undefined4 local_208;
  undefined8 ***local_200;
  undefined8 ***local_1f8;
  undefined8 local_1f0;
  Zp_field_operators<unsigned_int,_void> *pZStack_1e8;
  undefined1 *local_1e0;
  Zp_field_operators<unsigned_int,_void> local_1d8;
  undefined1 local_1b8 [8];
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&local_1d8,5);
  local_220 = 0xffffffff;
  local_218 = (long *)0x0;
  local_210 = 0xffffffffffffffff;
  local_208 = 0xffffffff;
  local_1e0 = local_1b8;
  local_1f0 = 0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &local_200;
  local_1f8 = &local_200;
  pZStack_1e8 = &local_1d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3f4);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = "!col.is_paired()";
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x3f5);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
  ;
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_208 = 0xffffffff;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3f8);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = "!col.is_paired()";
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x3f9);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
  ;
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_208 = 2;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x3fc);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = "col.is_paired()";
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x3fd);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = "col.get_paired_chain_index() == 2";
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_208 = 0xffffffff;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x400);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = "!col.is_paired()";
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x401);
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
  ;
  local_248 = "";
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_001fe370;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_228 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  for (ppppuVar2 = (undefined8 ****)local_200; ppppuVar1 = (undefined8 ****)local_200,
      ppppuVar2 != &local_200; ppppuVar2 = (undefined8 ****)*ppppuVar2) {
    __k = (key_type *)ppppuVar2[2];
    if (local_218 != (long *)0x0) {
      this = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
              *)((ulong)__k->rowIndex_ * 0x30 + *local_218);
      pVar3 = std::
              _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
              ::equal_range(this,__k);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(this,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
    }
    if (__k != (key_type *)0x0) {
      operator_delete(__k,0xc);
    }
  }
  while (ppppuVar1 != &local_200) {
    ppppuVar2 = (undefined8 ****)*ppppuVar1;
    operator_delete(ppppuVar1,0x18);
    ppppuVar1 = ppppuVar2;
  }
  if (local_1d8.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void column_test_chain_methods() {
  typename Column::Column_settings settings(5);

  Column col(&settings);

  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());

  col.unassign_paired_chain();
  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());

  col.assign_paired_chain(2);
  BOOST_CHECK(col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == 2);

  col.unassign_paired_chain();
  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());
}